

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

internal_node<char,_false> *
immutable::rrb_details::internal_node_merge<char,false>
          (ref<immutable::rrb_details::internal_node<char,_false>_> *left,
          ref<immutable::rrb_details::internal_node<char,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<char,_false>_> *right)

{
  ulong uVar1;
  internal_node<char,_false> *piVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  uVar3 = 0;
  uVar7 = 0;
  if (left->ptr != (internal_node<char,_false> *)0x0) {
    uVar7 = left->ptr->len - 1;
  }
  if (centre->ptr != (internal_node<char,_false> *)0x0) {
    uVar3 = (ulong)centre->ptr->len;
  }
  if (right->ptr == (internal_node<char,_false> *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(right->ptr->len - 1);
  }
  uVar6 = (int)uVar3 + uVar7;
  uVar4 = (int)uVar1 + uVar6;
  piVar2 = (internal_node<char,_false> *)malloc((ulong)uVar4 * 8 + 0x20);
  piVar2->len = uVar4;
  piVar2->type = INTERNAL_NODE;
  (piVar2->size_table).ptr = (rrb_size_table<false> *)0x0;
  piVar2->guid = 0;
  piVar2->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar2 + 1);
  memset(piVar2 + 1,0,(ulong)uVar4 * 8);
  if (uVar7 != 0) {
    lVar8 = 0;
    do {
      if (left->ptr == (internal_node<char,_false> *)0x0) goto LAB_00146344;
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 ((long)&piVar2->child->ptr + lVar8),
                 (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 ((long)&left->ptr->child->ptr + lVar8));
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar7 << 3 != lVar8);
  }
  if ((int)uVar3 != 0) {
    lVar8 = 0;
    do {
      if (centre->ptr == (internal_node<char,_false> *)0x0) goto LAB_00146344;
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (piVar2->child + uVar7,
                 (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 ((long)&centre->ptr->child->ptr + lVar8));
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar3 << 3 != lVar8);
  }
  if ((int)uVar1 != 0) {
    lVar8 = 0;
    do {
      if (right->ptr == (internal_node<char,_false> *)0x0) {
LAB_00146344:
        __assert_fail("ptr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                      ,0x71a,
                      "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
                     );
      }
      lVar5 = lVar8 + 8;
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (piVar2->child + uVar6,
                 (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 ((long)&right->ptr->child[1].ptr + lVar8));
      uVar6 = uVar6 + 1;
      lVar8 = lVar5;
    } while (uVar1 << 3 != lVar5);
  }
  return piVar2;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_merge(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right)
      {
      // If internal node is NULL, its size is zero.
      uint32_t left_len = (left.ptr == nullptr) ? 0 : left->len - 1;
      uint32_t centre_len = (centre.ptr == nullptr) ? 0 : centre->len;
      uint32_t right_len = (right.ptr == nullptr) ? 0 : right->len - 1;

      internal_node<T, atomic_ref_counting>* merged = internal_node_create<T, atomic_ref_counting>(left_len + centre_len + right_len);
      for (uint32_t i = 0; i < left_len; ++i)
        merged->child[i] = left->child[i];
      for (uint32_t i = 0; i < centre_len; ++i)
        merged->child[left_len + i] = centre->child[i];
      for (uint32_t i = 0; i < right_len; ++i)
        merged->child[left_len + centre_len + i] = right->child[i + 1];

      return merged;
      }